

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O3

Impl * absl::lts_20240722::time_internal::cctz::time_zone::Impl::UTCImpl(void)

{
  int iVar1;
  Impl *this;
  
  if (UTCImpl()::utc_impl == '\0') {
    iVar1 = __cxa_guard_acquire(&UTCImpl()::utc_impl);
    if (iVar1 != 0) {
      this = (Impl *)operator_new(0x28);
      Impl(this);
      UTCImpl::utc_impl = this;
      __cxa_guard_release(&UTCImpl()::utc_impl);
    }
  }
  return UTCImpl::utc_impl;
}

Assistant:

const time_zone::Impl* time_zone::Impl::UTCImpl() {
  static const Impl* utc_impl = new Impl;
  return utc_impl;
}